

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dominator_tree.h
# Opt level: O1

bool __thiscall
spvtools::opt::DominatorTree::Visit
          (DominatorTree *this,function<bool_(const_spvtools::opt::DominatorTreeNode_*)> *func)

{
  NodePtr pDVar1;
  bool bVar2;
  bool bVar3;
  DominatorTreeNode n;
  const_iterator __begin2;
  const_iterator __end2;
  DominatorTreeNode *local_120;
  DominatorTreeNode local_118;
  const_iterator local_e0;
  const_iterator local_88;
  
  cbegin(&local_e0,this);
  cend(&local_88,this);
  bVar3 = local_e0.current_ == local_88.current_;
  if (!bVar3) {
    do {
      pDVar1 = local_e0.current_;
      local_118.bb_ = (local_e0.current_)->bb_;
      local_118.parent_ = (local_e0.current_)->parent_;
      std::
      vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
      ::vector(&local_118.children_,&(local_e0.current_)->children_);
      local_118.dfs_num_pre_ = pDVar1->dfs_num_pre_;
      local_118.dfs_num_post_ = pDVar1->dfs_num_post_;
      local_120 = &local_118;
      if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      bVar2 = (*func->_M_invoker)((_Any_data *)func,&local_120);
      if (local_118.children_.
          super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_118.children_.
                        super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_118.children_.
                              super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_118.children_.
                              super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (!bVar2) break;
      TreeDFIterator<const_spvtools::opt::DominatorTreeNode>::operator++(&local_e0);
      bVar3 = local_e0.current_ == local_88.current_;
    } while (!bVar3);
  }
  std::
  _Deque_base<std::pair<const_spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<const_spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
  ::~_Deque_base((_Deque_base<std::pair<const_spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<const_spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                  *)&local_88.parent_iterators_);
  std::
  _Deque_base<std::pair<const_spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<const_spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
  ::~_Deque_base((_Deque_base<std::pair<const_spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<const_spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                  *)&local_e0.parent_iterators_);
  return bVar3;
}

Assistant:

bool Visit(std::function<bool(const DominatorTreeNode*)> func) const {
    for (auto n : *this) {
      if (!func(&n)) return false;
    }
    return true;
  }